

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_decoder.cc
# Opt level: O0

bool __thiscall draco::ObjDecoder::ParseMaterialFileDefinition(ObjDecoder *this,Status *param_2)

{
  bool bVar1;
  DecoderBuffer *pDVar2;
  DecoderBuffer *out_string;
  ulong uVar3;
  mapped_type *pmVar4;
  ObjDecoder *in_RDI;
  string str;
  char c;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  int iVar5;
  DecoderBuffer *in_stack_ffffffffffffff80;
  DecoderBuffer *in_stack_ffffffffffffff88;
  string local_40 [39];
  char local_19 [24];
  byte local_1;
  
  buffer(in_RDI);
  parser::SkipWhitespace(in_stack_ffffffffffffff80);
  pDVar2 = buffer(in_RDI);
  bVar1 = DecoderBuffer::Peek<char>(pDVar2,local_19);
  if (!bVar1) {
    local_1 = 0;
    goto LAB_0011e365;
  }
  if (local_19[0] == '#') {
    buffer(in_RDI);
    parser::SkipLine((DecoderBuffer *)0x11e21c);
    local_1 = 1;
    goto LAB_0011e365;
  }
  std::__cxx11::string::string(local_40);
  buffer(in_RDI);
  bVar1 = parser::ParseString(in_stack_ffffffffffffff88,(string *)in_stack_ffffffffffffff80);
  if (bVar1) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffff80,
                            (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (bVar1) {
      pDVar2 = buffer(in_RDI);
      parser::SkipWhitespace(in_stack_ffffffffffffff80);
      out_string = buffer(in_RDI);
      parser::ParseLine(pDVar2,(string *)out_string);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) != 0) {
        local_1 = 0;
        goto LAB_0011e35b;
      }
      iVar5 = in_RDI->num_materials_;
      in_RDI->num_materials_ = iVar5 + 1;
      pmVar4 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                             *)in_stack_ffffffffffffff80,
                            (key_type *)CONCAT44(iVar5,in_stack_ffffffffffffff78));
      *pmVar4 = iVar5;
    }
    local_1 = 1;
  }
  else {
    local_1 = 0;
  }
LAB_0011e35b:
  std::__cxx11::string::~string(local_40);
LAB_0011e365:
  return (bool)(local_1 & 1);
}

Assistant:

bool ObjDecoder::ParseMaterialFileDefinition(Status * /* status */) {
  char c;
  parser::SkipWhitespace(buffer());
  if (!buffer()->Peek(&c)) {
    // End of file reached?.
    return false;
  }
  if (c == '#') {
    // Comment, ignore the line.
    parser::SkipLine(buffer());
    return true;
  }
  std::string str;
  if (!parser::ParseString(buffer(), &str)) {
    return false;
  }
  if (str == "newmtl") {
    parser::SkipWhitespace(buffer());
    parser::ParseLine(buffer(), &str);
    if (str.empty()) {
      return false;
    }
    // Add new material to our map.
    material_name_to_id_[str] = num_materials_++;
  }
  return true;
}